

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O2

void pack_names(void)

{
  char cVar1;
  bucket *pbVar2;
  char *pcVar3;
  size_t sVar4;
  uint uVar5;
  char *pcVar6;
  bucket **ppbVar7;
  long lVar8;
  
  ppbVar7 = &first_symbol;
  uVar5 = 0xd;
  while( true ) {
    pbVar2 = *ppbVar7;
    if (pbVar2 == (bucket *)0x0) break;
    sVar4 = strlen(pbVar2->name);
    uVar5 = uVar5 + (int)sVar4 + 1;
    ppbVar7 = &pbVar2->next;
  }
  name_pool = (char *)malloc((ulong)uVar5);
  if (name_pool == (char *)0x0) {
    no_space();
  }
  pcVar6 = name_pool;
  builtin_strncpy(name_pool,"$accept",8);
  builtin_strncpy(pcVar6 + 8,"$end",5);
  pcVar6 = pcVar6 + 0xd;
  ppbVar7 = &first_symbol;
  while (pbVar2 = *ppbVar7, pbVar2 != (bucket *)0x0) {
    pcVar3 = pbVar2->name;
    lVar8 = 0;
    do {
      cVar1 = pcVar3[lVar8];
      pcVar6[lVar8] = cVar1;
      lVar8 = lVar8 + 1;
    } while (cVar1 != '\0');
    free(pbVar2->name);
    pbVar2->name = pcVar6;
    pcVar6 = pcVar6 + lVar8;
    ppbVar7 = &pbVar2->next;
  }
  return;
}

Assistant:

void pack_names()
{
    register bucket *bp;
    register char *p, *s, *t;

    name_pool_size = 13;  /* 13 == sizeof("$end") + sizeof("$accept") */
    for (bp = first_symbol; bp; bp = bp->next)
	name_pool_size += strlen(bp->name) + 1;
    name_pool = MALLOC(name_pool_size);
    if (name_pool == 0) no_space();

    strcpy(name_pool, "$accept");
    strcpy(name_pool+8, "$end");
    t = name_pool + 13;
    for (bp = first_symbol; bp; bp = bp->next) {
	p = t;
	s = bp->name;
	while ((*t++ = *s++)) continue;
	FREE(bp->name);
	bp->name = p; }
}